

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

Opnd * __thiscall IR::Instr::SetDst(Instr *this,Opnd *newDst)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Opnd *this_00;
  RegOpnd *pRVar4;
  SymOpnd *pSVar5;
  StackSym *local_20;
  StackSym *stackSym;
  Opnd *newDst_local;
  Instr *this_local;
  
  if (newDst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x895,"(newDst != nullptr)","Calling SetDst with a NULL dst");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this->m_dst != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x896,"(this->m_dst == nullptr)",
                       "Calling SetDst without unlinking/freeing the current dst");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = Opnd::IsRegOpnd(newDst);
  if (bVar2) {
    pRVar4 = Opnd::AsRegOpnd(newDst);
    bVar2 = RegOpnd::IsSymValueFrozen(pRVar4);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x897,
                         "(!(newDst->IsRegOpnd() && newDst->AsRegOpnd()->IsSymValueFrozen()))",
                         "!(newDst->IsRegOpnd() && newDst->AsRegOpnd()->IsSymValueFrozen())");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  this_00 = Opnd::Use(newDst,this->m_func);
  this->m_dst = this_00;
  bVar2 = Opnd::IsRegOpnd(this_00);
  if ((bVar2) && (pRVar4 = Opnd::AsRegOpnd(this_00), pRVar4->m_sym != (StackSym *)0x0)) {
    pRVar4 = Opnd::AsRegOpnd(this_00);
    local_20 = Sym::AsStackSym(&pRVar4->m_sym->super_Sym);
  }
  else {
    bVar2 = Opnd::IsSymOpnd(this_00);
    if (bVar2) {
      pSVar5 = Opnd::AsSymOpnd(this_00);
      bVar2 = Sym::IsStackSym(pSVar5->m_sym);
      if (bVar2) {
        pSVar5 = Opnd::AsSymOpnd(this_00);
        local_20 = Sym::AsStackSym(pSVar5->m_sym);
        goto LAB_00623962;
      }
    }
    local_20 = (StackSym *)0x0;
  }
LAB_00623962:
  if ((local_20 != (StackSym *)0x0) && ((*(uint *)&local_20->field_0x18 & 1) != 0)) {
    if ((local_20->field_5).m_instrDef == (Instr *)0x0) {
      (local_20->field_5).m_instrDef = this;
    }
    else {
      bVar2 = StackSym::IsArgSlotSym(local_20);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                           ,0x8b1,"(!stackSym->IsArgSlotSym())",
                           "Arg Slot sym needs to be single def to maintain the StartCall arg links"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      *(uint *)&local_20->field_0x18 = *(uint *)&local_20->field_0x18 & 0xfffffffe;
      (local_20->field_5).m_instrDef = (Instr *)0x0;
      *(uint *)&local_20->field_0x18 = *(uint *)&local_20->field_0x18 & 0xfffffff7;
      *(uint *)&local_20->field_0x18 = *(uint *)&local_20->field_0x18 & 0xffffffef;
      *(uint *)&local_20->field_0x18 = *(uint *)&local_20->field_0x18 & 0xffffff7f;
      *(uint *)&local_20->field_0x18 = *(uint *)&local_20->field_0x18 & 0xffffffdf;
      *(uint *)&local_20->field_0x18 = *(uint *)&local_20->field_0x18 & 0xfffffffd;
      *(uint *)&local_20->field_0x18 = *(uint *)&local_20->field_0x18 & 0xfffffbff;
      *(uint *)&local_20->field_0x18 = *(uint *)&local_20->field_0x18 & 0xfffff7ff;
      *(uint *)&local_20->field_0x18 = *(uint *)&local_20->field_0x18 & 0xfffffeff;
    }
  }
  return this_00;
}

Assistant:

Opnd *
Instr::SetDst(Opnd * newDst)
{
    AssertMsg(newDst != nullptr, "Calling SetDst with a NULL dst");
    AssertMsg(this->m_dst == nullptr, "Calling SetDst without unlinking/freeing the current dst");
    Assert(!(newDst->IsRegOpnd() && newDst->AsRegOpnd()->IsSymValueFrozen()));

    newDst = newDst->Use(m_func);
    this->m_dst = newDst;

    // If newDst isSingleDef, set instrDef

    StackSym *stackSym;

    if (newDst->IsRegOpnd() && newDst->AsRegOpnd()->m_sym)
    {
        stackSym = newDst->AsRegOpnd()->m_sym->AsStackSym();
    }
    else if (newDst->IsSymOpnd() && newDst->AsSymOpnd()->m_sym->IsStackSym())
    {
        stackSym = newDst->AsSymOpnd()->m_sym->AsStackSym();
    }
    else
    {
        stackSym = nullptr;
    }

    if (stackSym && stackSym->m_isSingleDef)
    {
        if (stackSym->m_instrDef)
        {
            AssertMsg(!stackSym->IsArgSlotSym(), "Arg Slot sym needs to be single def to maintain the StartCall arg links");

            // Multiple defs, clear isSingleDef flag
            stackSym->m_isSingleDef = false;
            stackSym->m_instrDef    = nullptr;
            stackSym->m_isConst     = false;
            stackSym->m_isIntConst  = false;
            stackSym->m_isInt64Const= false;
            stackSym->m_isTaggableIntConst  = false;
            stackSym->m_isNotNumber    = false;
            stackSym->m_isStrConst  = false;
            stackSym->m_isStrEmpty  = false;
            stackSym->m_isFltConst  = false;
        }
        else
        {
            stackSym->m_instrDef = this;
        }
    }

    return newDst;
}